

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O0

void OnGamefieldClick(Gamefield *gamefield,MousePos pos)

{
  byte bVar1;
  PixelType PVar2;
  SoundType soundType;
  Gamefield *in_RDI;
  IntVec2 in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  int height;
  int width;
  PixelType pixelType;
  uint8_t radius;
  IntVec2 coords;
  PixelType local_30;
  
  dVar3 = (double)in_RDI->height - in_XMM1_Qa;
  bVar1 = GetCurrentPixelsRadius();
  PVar2 = GetCurrentPixelType();
  for (soundType = (SoundType)((double)in_XMM0_Qa - (double)bVar1);
      (double)(int)soundType < (double)in_XMM0_Qa + (double)bVar1; soundType = soundType + Ambient)
  {
    for (local_30 = (PixelType)(dVar3 - (double)bVar1);
        (double)(int)local_30 < dVar3 + (double)bVar1; local_30 = local_30 + Water) {
      CreatePixel(in_RDI,in_XMM0_Qa,local_30);
    }
  }
  switch(PVar2) {
  case Sand:
    AudioManagerPlaySoundOnce(soundType);
    break;
  case Water:
    AudioManagerPlaySoundOnce(soundType);
    break;
  case Stone:
    AudioManagerPlaySoundOnce(soundType);
    break;
  case Plant:
    AudioManagerPlaySoundOnce(soundType);
    break;
  case Fire:
    AudioManagerPlaySoundOnce(soundType);
  }
  return;
}

Assistant:

void OnGamefieldClick(Gamefield* gamefield, MousePos pos) {
    pos.y = gamefield->height - pos.y;
    IntVec2 coords;

    uint8_t radius = GetCurrentPixelsRadius();
    PixelType pixelType = GetCurrentPixelType();

    for (int width = pos.x - radius; width < pos.x + radius; width++) {
        for (int height = pos.y - radius; height < pos.y + radius; height++) {
            coords.x = width;
            coords.y = height;
            CreatePixel(gamefield, coords, pixelType);
        }
    }

    switch (pixelType) {
        case Sand:
            AudioManagerPlaySoundOnce(SandSpawn);
            break;
        case Plant:
            AudioManagerPlaySoundOnce(PlantSpawn);
            break;
        case Water:
            AudioManagerPlaySoundOnce(WaterSpawn);
            break;
        case Stone:
            AudioManagerPlaySoundOnce(StoneSpawn);
            break;
        case Fire:
            AudioManagerPlaySoundOnce(FireSpawn);
            break;
    }
}